

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ExprCodeTemp(Parse *pParse,Expr *pExpr,int *pReg)

{
  int target;
  int iVar1;
  
  target = sqlite3GetTempReg(pParse);
  iVar1 = sqlite3ExprCodeTarget(pParse,pExpr,target);
  if (iVar1 != target) {
    sqlite3ReleaseTempReg(pParse,target);
    target = 0;
  }
  *pReg = target;
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeTemp(Parse *pParse, Expr *pExpr, int *pReg){
  int r1 = sqlite3GetTempReg(pParse);
  int r2 = sqlite3ExprCodeTarget(pParse, pExpr, r1);
  if( r2==r1 ){
    *pReg = r1;
  }else{
    sqlite3ReleaseTempReg(pParse, r1);
    *pReg = 0;
  }
  return r2;
}